

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall
QL_Manager::SetUpNodesWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s;
  uint numAttrToKeep;
  RC RVar1;
  size_t __n;
  QL_NodeProj *this_00;
  int iVar2;
  QL_Node *currNode;
  long lVar3;
  RelAttr attr;
  int attrIndex;
  int local_38;
  uint local_34;
  
  RVar1 = SetUpFirstNodeWithQO(this,topNode,qorels);
  if (RVar1 != 0) {
    return RVar1;
  }
  currNode = *topNode;
  local_34 = nSelAttrs;
  if (1 < this->nRels) {
    iVar2 = 1;
    do {
      RVar1 = JoinRelationWithQO(this,topNode,qorels,currNode,iVar2);
      if (RVar1 != 0) {
        return RVar1;
      }
      iVar2 = iVar2 + 1;
      currNode = *topNode;
    } while (iVar2 < this->nRels);
  }
  numAttrToKeep = local_34;
  if (local_34 == 1) {
    __s = selAttrs->attrName;
    __n = strlen(__s);
    iVar2 = strncmp(__s,"*",__n);
    if (iVar2 == 0) {
      return 0;
    }
  }
  this_00 = (QL_NodeProj *)operator_new(0x60);
  QL_NodeProj::QL_NodeProj(this_00,this,currNode);
  QL_NodeProj::SetUpNode(this_00,numAttrToKeep);
  if (0 < (int)numAttrToKeep) {
    lVar3 = 0;
    do {
      local_38 = 0;
      attr.attrName = *(char **)((long)&selAttrs->attrName + lVar3);
      attr.relName = *(char **)((long)&selAttrs->relName + lVar3);
      RVar1 = GetAttrCatEntryPos(this,attr,&local_38);
      if (RVar1 != 0) {
        return RVar1;
      }
      RVar1 = QL_NodeProj::AddProj(this_00,local_38);
      if (RVar1 != 0) {
        return RVar1;
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)numAttrToKeep << 4 != lVar3);
  }
  *topNode = (QL_Node *)this_00;
  return 0;
}

Assistant:

RC QL_Manager::SetUpNodesWithQO(QL_Node *&topNode, QO_Rel* qorels, int nSelAttrs, const RelAttr selAttrs[]){
  RC rc = 0;
  if((rc = SetUpFirstNodeWithQO(topNode, qorels)))
    return (rc);

  // For all other relations, join it, left-deep style, with the previously
  // seen relations
  QL_Node* currNode;
  currNode = topNode;
  for(int i = 1; i < nRels; i++){
    if((rc = JoinRelationWithQO(topNode, qorels, currNode, i)))
      return (rc);
    currNode = topNode;
  }

  // If select *, don't add project nodes
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);
  // Otherwise, add a project node, and give it the attributes to project
  QL_NodeProj *projNode = new QL_NodeProj(*this, *currNode);
  projNode->SetUpNode(nSelAttrs);
  for(int i= 0 ; i < nSelAttrs; i++){
    int attrIndex = 0;
    if((rc = GetAttrCatEntryPos(selAttrs[i], attrIndex)))
      return (rc);
    if((rc = projNode->AddProj(attrIndex)))
      return (rc);
  }
  topNode = projNode;
  return (rc);
}